

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::~Ifc2DCompositeCurve(Ifc2DCompositeCurve *this)

{
  ~Ifc2DCompositeCurve
            ((Ifc2DCompositeCurve *)
             &this[-1].super_IfcCompositeCurve.super_IfcBoundedCurve.super_IfcCurve.
              super_IfcGeometricRepresentationItem.field_0x28);
  return;
}

Assistant:

Ifc2DCompositeCurve() : Object("Ifc2DCompositeCurve") {}